

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
external_light_sensor_message_write_read::test_method
          (external_light_sensor_message_write_read *this)

{
  bool bVar1;
  const_string *message;
  external_light_sensor_message *message_00;
  buffer_reader *reader_00;
  external_light_sensor_message write_msg;
  external_light_sensor_message read_msg;
  const_string local_f8;
  char *local_e8;
  char *local_e0;
  binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
  local_d8;
  const_string local_c8;
  const_string local_b8;
  buffer buffer;
  lazy_ostream local_90;
  undefined1 *local_80;
  char **local_78;
  undefined1 local_70 [24];
  buffer_writer writer;
  buffer_reader reader;
  
  write_msg.data._M_elems[0] = (array<double,_1UL>)(_Type)0x3fe3333333333333;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buffer_writer::buffer_writer(&writer,&buffer);
  message_00 = &write_msg;
  ::operator<<(&writer,message_00);
  buffer_reader::buffer_reader(&reader,&buffer);
  reader_00 = &reader;
  message = (const_string *)&read_msg;
  ::operator>>(reader_00,(external_light_sensor_message *)message);
  bVar1 = true;
  while (bVar1) {
    local_b8.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
    ;
    local_b8.m_end = "";
    local_c8.m_begin = "";
    local_c8.m_end = "";
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)reader_00,&local_b8,200,&local_c8);
    local_d8.m_lhs.m_value = (double *)message;
    local_d8.m_rhs = (double *)message_00;
    boost::test_tools::assertion::
    binary_expr<boost::test_tools::assertion::value_expr<double_&>,_double_&,_boost::test_tools::assertion::op::EQ<double,_double,_void>_>
    ::evaluate((assertion_result *)local_70,&local_d8,false);
    local_e8 = "read_msg.data[i] == write_msg.data[i]";
    local_e0 = "";
    local_90.m_empty = false;
    local_90._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001a9520;
    local_80 = boost::unit_test::lazy_ostream::inst;
    local_78 = &local_e8;
    local_f8.m_begin =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Stazer[P]autonomouscabs/test/cpp/main.cpp"
    ;
    local_f8.m_end = "";
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_70,&local_90,&local_f8,200,CHECK,CHECK_BUILT_ASSERTION,0);
    reader_00 = (buffer_reader *)(local_70 + 0x10);
    boost::detail::shared_count::~shared_count((shared_count *)reader_00);
    bVar1 = false;
    message = &local_f8;
    message_00 = &read_msg;
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(external_light_sensor_message_write_read)
{
    external_light_sensor_message write_msg;
    for(int i = 0; i<1; i++){
      write_msg.data[i] = static_cast<double>(i) + 0.6;
    }

    buffer buffer;
    buffer_writer writer(buffer);
    writer << write_msg;

    external_light_sensor_message read_msg;
    buffer_reader reader(buffer);
    reader >> read_msg;

    for(int i = 0; i<1; i++){
      BOOST_TEST(read_msg.data[i] == write_msg.data[i]);
    }
}